

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-ring.c
# Opt level: O3

lws_ring * lws_ring_create(size_t element_len,size_t count,_func_void_void_ptr *destroy_element)

{
  lws_ring *ptr;
  void *pvVar1;
  lws_ring *plVar2;
  uint uVar3;
  
  ptr = (lws_ring *)lws_realloc((void *)0x0,0x20,"ring create");
  plVar2 = (lws_ring *)0x0;
  if (ptr != (lws_ring *)0x0) {
    uVar3 = (int)count * (uint32_t)element_len;
    ptr->buflen = uVar3;
    ptr->element_len = (uint32_t)element_len;
    ptr->head = 0;
    ptr->oldest_tail = 0;
    ptr->destroy_element = destroy_element;
    pvVar1 = lws_realloc((void *)0x0,(ulong)uVar3,"ring buf");
    ptr->buf = pvVar1;
    plVar2 = ptr;
    if (pvVar1 == (void *)0x0) {
      lws_realloc(ptr,0,"lws_free");
      plVar2 = (lws_ring *)0x0;
    }
  }
  return plVar2;
}

Assistant:

struct lws_ring *
lws_ring_create(size_t element_len, size_t count,
		void (*destroy_element)(void *))
{
	struct lws_ring *ring = lws_malloc(sizeof(*ring), "ring create");

	if (!ring)
		return NULL;

	ring->buflen = (uint32_t)(count * element_len);
	ring->element_len = (uint32_t)element_len;
	ring->head = 0;
	ring->oldest_tail = 0;
	ring->destroy_element = destroy_element;

	ring->buf = lws_malloc(ring->buflen, "ring buf");
	if (!ring->buf) {
		lws_free(ring);

		return NULL;
	}

	return ring;
}